

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void pnga_add_patch(void *alpha,Integer g_a,Integer *alo,Integer *ahi,void *beta,Integer g_b,
                   Integer *blo,Integer *bhi,Integer g_c,Integer *clo,Integer *chi)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  Integer IVar7;
  long lVar8;
  Integer IVar9;
  Integer IVar10;
  Integer IVar11;
  logical lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  char notrans;
  long local_d10;
  Integer g_B;
  Integer g_A;
  char *C_ptr;
  char *B_ptr;
  char *A_ptr;
  Integer bndim;
  Integer andim;
  Integer local_cd0;
  Integer local_cc8;
  double *local_cc0;
  void *local_cb8;
  Integer atype;
  Integer loC [7];
  Integer hiC [7];
  Integer ctype;
  Integer local_c10;
  Integer ldC [7];
  Integer hiB [7];
  Integer loB [7];
  Integer hiA [7];
  Integer loA [7];
  Integer btype;
  long local_ac0;
  Integer lod [7];
  Integer ldB [7];
  Integer ldA [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_a;
  Integer bunit [7];
  _iterator_hdl hdl_c;
  
  g_B = g_b;
  g_A = g_a;
  local_cc8 = g_a;
  local_cc0 = (double *)beta;
  local_cb8 = alpha;
  IVar7 = pnga_nodeid();
  pnga_nnodes();
  iVar5 = _ga_sync_end;
  notrans = 'n';
  bVar17 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar17) {
    pnga_sync();
  }
  pnga_inquire(local_cc8,&atype,&andim,adims);
  local_cd0 = g_b;
  pnga_inquire(g_b,&btype,&bndim,bdims);
  pnga_inquire(g_c,&ctype,&local_d10,cdims);
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  for (lVar14 = 0; lVar14 < andim; lVar14 = lVar14 + 1) {
    if ((alo[lVar14] < 1) || (adims[lVar14] < ahi[lVar14])) {
      pnga_error("g_a indices out of range ",local_cc8);
    }
  }
  for (lVar14 = 0; lVar14 < bndim; lVar14 = lVar14 + 1) {
    if ((blo[lVar14] < 1) || (bdims[lVar14] < bhi[lVar14])) {
      pnga_error("g_b indices out of range ",local_cd0);
    }
  }
  for (lVar14 = 0; lVar14 < local_d10; lVar14 = lVar14 + 1) {
    if ((clo[lVar14] < 1) || (cdims[lVar14] < chi[lVar14])) {
      pnga_error("g_c indices out of range ",g_c);
    }
  }
  lVar13 = 0;
  lVar14 = local_d10;
  if (local_d10 < 1) {
    lVar14 = lVar13;
  }
  lVar8 = 1;
  for (; lVar14 != lVar13; lVar13 = lVar13 + 1) {
    lVar8 = lVar8 * ((chi[lVar13] - clo[lVar13]) + 1);
  }
  lVar14 = 0;
  IVar9 = andim;
  if (andim < 1) {
    IVar9 = lVar14;
  }
  lVar13 = 1;
  for (; IVar9 != lVar14; lVar14 = lVar14 + 1) {
    lVar13 = lVar13 * ((ahi[lVar14] - alo[lVar14]) + 1);
  }
  lVar14 = 0;
  IVar9 = bndim;
  if (bndim < 1) {
    IVar9 = lVar14;
  }
  lVar15 = 1;
  for (; IVar9 != lVar14; lVar14 = lVar14 + 1) {
    lVar15 = lVar15 * ((bhi[lVar14] - blo[lVar14]) + 1);
  }
  if ((lVar13 != lVar8) || (lVar15 != lVar8)) {
    pnga_error("  capacities of patches do not match ",0);
  }
  IVar9 = pnga_total_blocks(local_cc8);
  IVar10 = pnga_total_blocks(local_cd0);
  IVar11 = pnga_total_blocks(g_c);
  if (((IVar9 < 0) && (IVar10 < 0)) && (IVar11 < 0)) {
    pnga_distribution(g_A,IVar7,loA,hiA);
    pnga_distribution(g_B,IVar7,loB,hiB);
    pnga_distribution(g_c,IVar7,loC,hiC);
    IVar9 = andim;
    lVar14 = local_d10;
    lVar12 = pnga_comp_patch(andim,loA,hiA,local_d10,loC,hiC);
    if ((lVar12 == 0) || (lVar12 = pnga_comp_patch(IVar9,alo,ahi,lVar14,clo,chi), lVar12 == 0)) {
      lod[0] = 0;
    }
    else {
      lod[0] = 1;
    }
    IVar9 = pnga_type_f2c(0x3f2);
    lVar14 = 1;
    pnga_gop(IVar9,lod,1,"&&");
    IVar9 = bndim;
    local_c10 = local_d10;
    lVar12 = pnga_comp_patch(bndim,loB,hiB,local_d10,loC,hiC);
    if ((lVar12 == 0) || (lVar12 = pnga_comp_patch(IVar9,blo,bhi,local_c10,clo,chi), lVar12 == 0)) {
      lVar14 = 0;
    }
    local_ac0 = lVar14;
    IVar9 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar9,&local_ac0,1,"&&");
    IVar10 = local_cd0;
    IVar9 = bndim;
    if (local_ac0 != 0 && lod[0] != 0) {
      if ((andim != bndim) && (local_d10 = bndim, andim < bndim)) {
        local_d10 = andim;
      }
      lVar14 = local_d10;
      lVar12 = pnga_comp_patch(andim,loA,hiA,local_d10,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar14 = local_d10;
        IVar9 = bndim;
      }
      lVar12 = pnga_comp_patch(IVar9,loB,hiB,lVar14,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar14 = local_d10;
      }
      lVar12 = pnga_patch_intersect(clo,chi,loC,hiC,lVar14);
      if (lVar12 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_add_patch_values(atype,local_cb8,local_cc0,local_d10,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
        pnga_release_update(g_c,loC,hiC);
      }
      goto LAB_0016b29d;
    }
    if (lod[0] == 0 && local_ac0 != 0) {
      if (local_cd0 == g_c) {
        lVar12 = pnga_duplicate(local_cd0,&g_A,"temp");
        if (lVar12 == 0) {
          pnga_error("ga_dadd_patch: dup failed",0);
        }
        pnga_copy_patch(&notrans,local_cc8,alo,ahi,g_A,clo,chi);
      }
      else {
        pnga_copy_patch(&notrans,local_cc8,alo,ahi,g_c,clo,chi);
        g_A = g_c;
      }
      andim = local_d10;
      pnga_distribution(g_A,IVar7,loA,hiA);
      IVar7 = bndim;
      if ((andim != bndim) && (local_d10 = bndim, andim < bndim)) {
        local_d10 = andim;
      }
      lVar14 = local_d10;
      lVar12 = pnga_comp_patch(andim,loA,hiA,local_d10,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar14 = local_d10;
        IVar7 = bndim;
      }
      lVar12 = pnga_comp_patch(IVar7,loB,hiB,lVar14,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar14 = local_d10;
      }
      lVar12 = pnga_patch_intersect(clo,chi,loC,hiC,lVar14);
      if (lVar12 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        IVar10 = local_cd0;
        snga_add_patch_values(atype,local_cb8,local_cc0,local_d10,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
        pnga_release_update(g_c,loC,hiC);
      }
      IVar7 = g_A;
      if (IVar10 != g_c) goto LAB_0016b29d;
    }
    else if (local_ac0 == 0 && lod[0] != 0) {
      lVar12 = pnga_duplicate(g_c,&g_B,"temp");
      if (lVar12 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&notrans,local_cd0,blo,bhi,g_B,clo,chi);
      bndim = local_d10;
      pnga_distribution(g_B,IVar7,loB,hiB);
      IVar7 = bndim;
      if ((andim != bndim) && (local_d10 = bndim, andim < bndim)) {
        local_d10 = andim;
      }
      lVar14 = local_d10;
      lVar12 = pnga_comp_patch(andim,loA,hiA,local_d10,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar14 = local_d10;
        IVar7 = bndim;
      }
      lVar12 = pnga_comp_patch(IVar7,loB,hiB,lVar14,loC,hiC);
      if (lVar12 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar14 = local_d10;
      }
      lVar12 = pnga_patch_intersect(clo,chi,loC,hiC,lVar14);
      IVar7 = g_B;
      if (lVar12 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_add_patch_values(atype,local_cb8,local_cc0,local_d10,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
LAB_0016bd3f:
        pnga_release_update(g_c,loC,hiC);
        IVar7 = g_B;
      }
    }
    else {
      if (lod[0] != 0 || local_ac0 != 0) goto LAB_0016b29d;
      lVar12 = pnga_duplicate(g_c,&g_B,"temp");
      if (lVar12 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&notrans,local_cd0,blo,bhi,g_B,clo,chi);
      bndim = local_d10;
      pnga_copy_patch(&notrans,local_cc8,alo,ahi,g_c,clo,chi);
      pnga_scale_patch(g_c,clo,chi,local_cb8);
      lVar12 = pnga_patch_intersect(clo,chi,loC,hiC,local_d10);
      IVar7 = g_B;
      if (lVar12 != 0) {
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        lVar14 = 1;
        lVar13 = lVar14;
        for (; lVar14 < local_d10; lVar14 = lVar14 + 1) {
          lVar13 = lVar13 * ((hiC[lVar14] - loC[lVar14]) + 1);
        }
        hdl_a.g_a = 0;
        hdl_a.lo[0] = 0;
        bunit[0] = 1;
        bunit[1] = 1;
        hdl_c.g_a = ldC[0];
        hdl_c.lo[0] = ldC[0] * ldC[1];
        for (lVar14 = 2; lVar14 < local_d10; lVar14 = lVar14 + 1) {
          hdl_a.lo[lVar14 + -1] = 0;
          bunit[lVar14] = ((hiC[lVar14 + -1] - loC[lVar14 + -1]) + 1) * hdl_a.index[lVar14 + 6];
          hdl_c.lo[lVar14 + -1] = ldC[lVar14] * hdl_c.lo[lVar14 + -2];
        }
        switch(atype) {
        case 0x3e9:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              *(int *)(C_ptr + lVar8 * 4 + lVar15 * 4) =
                   *(int *)(C_ptr + lVar8 * 4 + lVar15 * 4) +
                   *(int *)(B_ptr + lVar8 * 4 + lVar15 * 4) * (int)*(float *)local_cc0;
            }
          }
          break;
        case 0x3ea:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              *(long *)(C_ptr + lVar8 * 8 + lVar15 * 8) =
                   *(long *)(C_ptr + lVar8 * 8 + lVar15 * 8) +
                   *(long *)(B_ptr + lVar8 * 8 + lVar15 * 8) * (long)*local_cc0;
            }
          }
          break;
        case 0x3eb:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              *(float *)(C_ptr + lVar8 * 4 + lVar15 * 4) =
                   *(float *)local_cc0 * *(float *)(B_ptr + lVar8 * 4 + lVar15 * 4) +
                   *(float *)(C_ptr + lVar8 * 4 + lVar15 * 4);
            }
          }
          break;
        case 0x3ec:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              *(double *)(C_ptr + lVar8 * 8 + lVar15 * 8) =
                   *local_cc0 * *(double *)(B_ptr + lVar8 * 8 + lVar15 * 8) +
                   *(double *)(C_ptr + lVar8 * 8 + lVar15 * 8);
            }
          }
          break;
        default:
          pnga_error(" wrong data type ",atype);
          break;
        case 0x3ee:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              fVar18 = (float)*(undefined8 *)(B_ptr + lVar8 * 8 + lVar15 * 8);
              fVar19 = (float)((ulong)*(undefined8 *)(B_ptr + lVar8 * 8 + lVar15 * 8) >> 0x20);
              *(ulong *)(C_ptr + lVar8 * 8 + lVar15 * 8) =
                   CONCAT44(*(float *)((long)local_cc0 + 4) * fVar18 +
                            *(float *)local_cc0 * fVar19 +
                            (float)((ulong)*(undefined8 *)(C_ptr + lVar8 * 8 + lVar15 * 8) >> 0x20),
                            -*(float *)((long)local_cc0 + 4) * fVar19 +
                            *(float *)local_cc0 * fVar18 +
                            (float)*(undefined8 *)(C_ptr + lVar8 * 8 + lVar15 * 8));
            }
          }
          break;
        case 0x3ef:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            lVar15 = lVar15 << 4;
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              dVar3 = *(double *)(B_ptr + lVar15);
              dVar4 = *(double *)((long)(B_ptr + lVar15) + 8);
              dVar2 = local_cc0[1] * dVar3 +
                      *local_cc0 * dVar4 + *(double *)((long)(C_ptr + lVar15) + 8);
              auVar1._8_4_ = SUB84(dVar2,0);
              auVar1._0_8_ = -local_cc0[1] * dVar4 +
                             *local_cc0 * dVar3 + *(double *)(C_ptr + lVar15);
              auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
              *(undefined1 (*) [16])(C_ptr + lVar15) = auVar1;
              lVar15 = lVar15 + 0x10;
            }
          }
          break;
        case 0x3f8:
          lVar14 = 0;
          if (lVar13 < 1) {
            lVar13 = lVar14;
          }
          while (lVar14 != lVar13) {
            lVar14 = lVar14 + 1;
            lVar15 = 0;
            for (lVar8 = 1; lVar8 < local_d10; lVar8 = lVar8 + 1) {
              lVar15 = lVar15 + hdl_c.lo[lVar8 + -2] * hdl_a.lo[lVar8 + -1];
              lVar16 = hdl_a.lo[lVar8 + -1] + (ulong)(lVar14 % bunit[lVar8] == 0);
              IVar7 = 0;
              if (lVar16 <= hiC[lVar8] - loC[lVar8]) {
                IVar7 = lVar16;
              }
              hdl_a.lo[lVar8 + -1] = IVar7;
            }
            for (lVar8 = 0; lVar8 <= hiC[0] - loC[0]; lVar8 = lVar8 + 1) {
              *(long *)(C_ptr + lVar8 * 8 + lVar15 * 8) =
                   *(long *)(C_ptr + lVar8 * 8 + lVar15 * 8) +
                   *(long *)(B_ptr + lVar8 * 8 + lVar15 * 8) * (long)*local_cc0;
            }
          }
        }
        pnga_release(g_B,loC,hiC);
        goto LAB_0016bd3f;
      }
    }
  }
  else {
    lVar12 = pnga_duplicate(g_c,&g_A,"temp");
    if (lVar12 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_cc8,alo,ahi,g_A,clo,chi);
    andim = local_d10;
    lVar12 = pnga_duplicate(g_c,&g_B,"temp");
    if (lVar12 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_cd0,blo,bhi,g_B,clo,chi);
    bndim = local_d10;
    pnga_local_iterator_init(g_A,&hdl_a);
    pnga_local_iterator_init(g_B,(_iterator_hdl *)bunit);
    pnga_local_iterator_init(g_c,&hdl_c);
    while (iVar6 = pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC), iVar6 != 0) {
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next((_iterator_hdl *)bunit,loB,hiB,&B_ptr,ldB);
      lVar14 = local_d10;
      lVar13 = 0;
      if (0 < local_d10) {
        lVar13 = local_d10;
      }
      for (lVar8 = 0; lVar13 != lVar8; lVar8 = lVar8 + 1) {
        lod[lVar8] = loC[lVar8];
      }
      lVar12 = pnga_patch_intersect(clo,chi,loC,hiC,local_d10);
      if (lVar12 != 0) {
        lVar13 = lVar14 + -1;
        if (lVar13 < 1) {
          lVar13 = 0;
        }
        lVar15 = 0;
        lVar8 = 1;
        for (lVar16 = 0; lVar13 != lVar16; lVar16 = lVar16 + 1) {
          lVar15 = lVar15 + (loC[lVar16] - lod[lVar16]) * lVar8;
          lVar8 = lVar8 * ldC[lVar16];
        }
        if (ctype - 0x3e9U < 0x10) {
          lVar15 = (loC[lVar14 + -1] - lod[lVar14 + -1]) * lVar8 + lVar15;
          switch(ctype) {
          case 0x3e9:
          case 0x3eb:
            A_ptr = A_ptr + lVar15 * 4;
            lVar15 = lVar15 * 4;
            break;
          case 0x3ea:
          case 0x3ec:
          case 0x3ee:
          case 0x3f8:
            A_ptr = A_ptr + lVar15 * 8;
            lVar15 = lVar15 * 8;
            break;
          default:
            goto switchD_0016b217_caseD_3ed;
          case 0x3ef:
            lVar15 = lVar15 * 0x10;
            A_ptr = A_ptr + lVar15;
          }
          B_ptr = B_ptr + lVar15;
          C_ptr = C_ptr + lVar15;
        }
        else {
switchD_0016b217_caseD_3ed:
        }
        snga_add_patch_values(atype,local_cb8,local_cc0,lVar14,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
      }
    }
    pnga_destroy(g_A);
    IVar7 = g_B;
  }
  pnga_destroy(IVar7);
LAB_0016b29d:
  if (iVar5 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_add_patch(alpha, g_a, alo, ahi, beta,  g_b, blo, bhi,
                         g_c, clo, chi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
void *alpha, *beta;
{
  Integer i, j;
  Integer compatible_a, compatible_b;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  Integer nproc = pnga_nnodes();
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution( g_A, me, loA, hiA);
    pnga_distribution( g_B, me, loB, hiB);
    pnga_distribution( g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
       pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible_a = 1;
    else compatible_a = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "&&");
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
       pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible_b = 1;
    else compatible_b = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "&&");
    if (compatible_a && compatible_b) {
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      } else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (compatible_a && !compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);

      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && !compatible_b) {
      /* there is no match between any of the global arrays */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      cndim = bndim;
      pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
      pnga_scale_patch(g_c, clo, chi, alpha);
      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_acc_patch_values(atype, beta, cndim, loC, hiC, ldC,
                              B_ptr, C_ptr);
        /* release access to the data */
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
        /*hid[j] = hiC[j];*/
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {

        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;

        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          case C_LONGLONG:
            A_ptr = (void*)((long long*)(A_ptr) + offset);
            B_ptr = (void*)((long long*)(B_ptr) + offset);
            C_ptr = (void*)((long long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);
      }
    }
#else
    /* C is normally distributed so just add copies together for regular
       arrays */
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      /* Simple block-cyclic data disribution */
      if (!pnga_uses_proc_grid(g_c)) {
        for (idx = me; idx < num_blocks_c; idx += nproc) {
          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx); 
            pnga_release_update_block(g_c, idx); 
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer lod[MAXDIM]/*, hid[MAXDIM], chk*/;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /*if (hiC[i] < loC[i]) chk = 0;*/
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block_grid       ( g_A, index);
            pnga_release_block_grid       ( g_B, index); 
            pnga_release_update_block_grid(g_c, index); 
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}